

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<double>::Clear
          (RepeatedFieldWrapper<double> *this,Field *data)

{
  RepeatedField<double> *this_00;
  Field *data_local;
  RepeatedFieldWrapper<double> *this_local;
  
  this_00 = (RepeatedField<double> *)(**(code **)(*(long *)this + 0x88))(this,data);
  RepeatedField<double>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }